

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  cstring_r *pcVar1;
  char *identifier;
  symboltable_t *table;
  gnode_t *pgVar2;
  
  if (**self->data == 0) {
    pgVar2 = (gnode_t *)0x0;
  }
  else {
    pgVar2 = *(gnode_t **)(*self->data)[2];
  }
  pcVar1 = node->identifiers;
  if ((pcVar1 != (cstring_r *)0x0) && (pcVar1->n != 0)) {
    identifier = *pcVar1->p;
    table = symtable_from_node(pgVar2);
    if (table != (symboltable_t *)0x0) {
      pgVar2 = symboltable_lookup(table,identifier);
      if (pgVar2 != (gnode_t *)0x0) {
        (node->location).type = LOCATION_GLOBAL;
        (node->location).index = 0;
        (node->location).nup = 0;
        return;
      }
    }
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Module identifier %s not found.",
                 identifier);
    return;
  }
  __assert_fail("n",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_semacheck2.c"
                ,0x47e,"void visit_file_expr(gvisitor_t *, gnode_file_expr_t *)");
}

Assistant:

static void visit_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    DEBUG_CODEGEN("visit_file_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // check if the node is a left expression of an assignment
    bool is_assignment = node->base.is_assignment;

    size_t count = gnode_array_size(node->identifiers);
    for (size_t i=0; i<count; ++i) {
        const char *identifier = gnode_array_get(node->identifiers, i);
        uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));

        if ((is_assignment) && (IS_LAST_LOOP(i, count))) {
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid file expression.");
			ircode_add(code, STOREG, reg, kindex, 0, LINE_NUMBER(node));
        } else {
			ircode_add(code, LOADG, ircode_register_push_temp(code), kindex, 0, LINE_NUMBER(node));
        }
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);
}